

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O2

void asio::detail::executor_function::
     complete<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,asio::any_io_executor,asio::ip::basic_resolver_iterator<asio::ip::tcp>,asio::detail::default_connect_condition,std::_Bind<void(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,std::shared_ptr<nuraft::req_msg>,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>,unsigned_long,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&,unsigned_long,std::error_code,asio::ip::basic_resolver_iterator<asio::ip::tcp>)>>,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  allocator<void> allocator;
  ptr p;
  binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>
  function;
  allocator<void> local_c9;
  ptr local_c8;
  binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>
  local_b0;
  
  local_c8.a = &local_c9;
  local_c8.v = base;
  local_c8.p = (impl<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>,_std::allocator<void>_>
                *)base;
  binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>
  ::binder1(&local_b0,
            (binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>
             *)(base + 1));
  impl<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_c8);
  if (call) {
    binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>
    ::operator()(&local_b0);
  }
  iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>
  ::~iterator_connect_op(&local_b0.handler_);
  impl<asio::detail::binder1<asio::detail::iterator_connect_op<asio::ip::tcp,_asio::any_io_executor,_asio::ip::basic_resolver_iterator<asio::ip::tcp>,_asio::detail::default_connect_condition,_std::_Bind<void_(nuraft::asio_rpc_client::*(std::shared_ptr<nuraft::asio_rpc_client>,_std::shared_ptr<nuraft::req_msg>,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>,_unsigned_long,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::req_msg>_&,_std::function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_&,_unsigned_long,_std::error_code,_asio::ip::basic_resolver_iterator<asio::ip::tcp>)>_>,_std::error_code>,_std::allocator<void>_>
  ::ptr::~ptr(&local_c8);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(ASIO_MOVE_CAST(Function)(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      asio_handler_invoke_helpers::invoke(function, function);
    }
  }